

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

QPalette __thiscall QStyle::standardPalette(QStyle *this)

{
  undefined8 extraout_RDX;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar1 [16];
  QPalette QVar2;
  QPalette *palette;
  QColor mid;
  QColor dark;
  QColor light;
  QColor background;
  int in_stack_ffffffffffffff20;
  ColorGroup CVar3;
  QPalette *this_00;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  QBrush local_b8 [8];
  QBrush local_b0 [8];
  QBrush local_a8 [8];
  QBrush local_a0 [8];
  undefined1 local_98 [16];
  undefined6 local_88;
  undefined2 uStack_82;
  undefined6 local_80;
  undefined2 uStack_7a;
  QColor local_78;
  QColor local_68;
  QColor local_58;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined6 local_28;
  undefined2 uStack_22;
  undefined6 uStack_20;
  undefined2 uStack_1a;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QColor::QColor((QColor *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,200,in_stack_ffffffffffffff20);
  local_28 = 0xaaaaaaaaaaaa;
  uStack_22 = 0xaaaa;
  uStack_20 = 0xaaaaaaaaaaaa;
  uStack_1a = 0xaaaa;
  auVar1 = QColor::lighter((int)&local_18);
  local_80 = auVar1._8_6_;
  uStack_7a = auVar1._14_2_;
  local_88 = auVar1._0_6_;
  uStack_82 = auVar1._6_2_;
  uStack_20 = local_80;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = local_88;
  uStack_22 = uStack_82;
  local_98 = QColor::darker((int)&local_18);
  local_38 = local_98._0_8_;
  puStack_30._0_6_ = local_98._8_6_;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor((QColor *)local_48,gray);
  this_00->d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this_00->currentGroup = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor(&local_58,black);
  QColor::QColor(&local_68,black);
  QColor::QColor(&local_78,white);
  QPalette::QPalette(this_00,(QColor *)&local_58,(QColor *)&local_18,(QColor *)&local_28,
                     (QColor *)&local_38,(QColor *)local_48,(QColor *)&local_68,(QColor *)&local_78)
  ;
  CVar3 = (ColorGroup)this_00;
  QBrush::QBrush(local_a0,(QColor *)&local_38,SolidPattern);
  QPalette::setBrush(CVar3,Button,(QBrush *)0x0);
  QBrush::~QBrush(local_a0);
  QBrush::QBrush(local_a8,(QColor *)&local_38,SolidPattern);
  QPalette::setBrush(CVar3,Button,(QBrush *)0x6);
  QBrush::~QBrush(local_a8);
  QBrush::QBrush(local_b0,(QColor *)&local_38,SolidPattern);
  QPalette::setBrush(CVar3,Button,(QBrush *)0x8);
  QBrush::~QBrush(local_b0);
  QBrush::QBrush(local_b8,(QColor *)&local_18,SolidPattern);
  QPalette::setBrush(CVar3,Button,(QBrush *)0x9);
  QBrush::~QBrush(local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar2._8_8_ = extraout_RDX;
  QVar2.d = (QPalettePrivate *)in_RDI;
  return QVar2;
}

Assistant:

QPalette QStyle::standardPalette() const
{
    QColor background = QColor(0xd4, 0xd0, 0xc8); // win 2000 grey

    QColor light(background.lighter());
    QColor dark(background.darker());
    QColor mid(Qt::gray);
    QPalette palette(Qt::black, background, light, dark, mid, Qt::black, Qt::white);
    palette.setBrush(QPalette::Disabled, QPalette::WindowText, dark);
    palette.setBrush(QPalette::Disabled, QPalette::Text, dark);
    palette.setBrush(QPalette::Disabled, QPalette::ButtonText, dark);
    palette.setBrush(QPalette::Disabled, QPalette::Base, background);
    return palette;
}